

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardIO.cpp
# Opt level: O0

uint BoardIO::GetFpgaVersionMajorFromStatus(uint32_t status)

{
  undefined4 local_10;
  uint fpga_ver;
  uint32_t status_local;
  
  local_10 = 0;
  if (status == 0) {
    local_10 = 1;
  }
  else if ((status & 0x80000000) == 0) {
    if ((status & 0x40000000) == 0x40000000) {
      local_10 = 3;
    }
  }
  else {
    local_10 = 2;
  }
  return local_10;
}

Assistant:

unsigned int BoardIO::GetFpgaVersionMajorFromStatus(uint32_t status)
{
    // FPGA V1:  all bits are 0
    // FPGA V2:  bit 31 is 1
    // FPGA V3:  bits[31:30] are 01
    unsigned int fpga_ver = 0;
    if (status == 0)
        fpga_ver = 1;
    else if (status&0x80000000)
        fpga_ver = 2;
    else if ((status&0x40000000) == 0x40000000)
        fpga_ver = 3;

    return fpga_ver;
}